

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Node.hpp
# Opt level: O2

void __thiscall
CX3DImporter_NodeElement_TextureTransform::CX3DImporter_NodeElement_TextureTransform
          (CX3DImporter_NodeElement_TextureTransform *this,CX3DImporter_NodeElement *pParent)

{
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar1;
  
  (this->super_CX3DImporter_NodeElement).Type = ENET_TextureTransform;
  (this->super_CX3DImporter_NodeElement).ID._M_dataplus._M_p =
       (pointer)&(this->super_CX3DImporter_NodeElement).ID.field_2;
  (this->super_CX3DImporter_NodeElement).ID._M_string_length = 0;
  (this->super_CX3DImporter_NodeElement).ID.field_2._M_local_buf[0] = '\0';
  (this->super_CX3DImporter_NodeElement).Parent = pParent;
  plVar1 = &(this->super_CX3DImporter_NodeElement).Child;
  (this->super_CX3DImporter_NodeElement).Child.
  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->super_CX3DImporter_NodeElement).Child.
  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->super_CX3DImporter_NodeElement).Child.
  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  (this->Center).x = 0.0;
  (this->Center).y = 0.0;
  (this->super_CX3DImporter_NodeElement)._vptr_CX3DImporter_NodeElement =
       (_func_int **)&PTR__CX3DImporter_NodeElement_00822998;
  (this->Scale).x = 0.0;
  (this->Scale).y = 0.0;
  (this->Translation).x = 0.0;
  (this->Translation).y = 0.0;
  return;
}

Assistant:

CX3DImporter_NodeElement(const EType pType, CX3DImporter_NodeElement* pParent)
		: Type(pType), Parent(pParent)
	{}